

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::microfacet::vndf(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  float fVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  vec3 vVar2;
  float local_e4;
  undefined8 uStack_b8;
  float_t sigma;
  float_t local_b0;
  undefined8 local_a8;
  float_t local_a0;
  float local_9c;
  float local_98;
  float_t D;
  float_t dwdw;
  float_t nrm;
  float_t nrmsqr;
  float_t dpd;
  float_t local_80;
  vec3 local_78;
  vec3 local_68;
  undefined1 local_5c [8];
  vec3 wi_std;
  float_t local_48;
  undefined1 local_40 [8];
  vec3 wm_std;
  args *args_local;
  vec3 *wi_local;
  vec3 *wm_local;
  microfacet *this_local;
  
  unique0x1000015c = args;
  vVar2 = djb::operator*(&args->mtra,wm);
  local_48 = vVar2.z;
  wm_std.x = local_48;
  wi_std._4_8_ = vVar2._0_8_;
  local_40._0_4_ = wi_std.y;
  local_40._4_4_ = wi_std.z;
  unique0x10000150 = vVar2;
  vVar2 = djb::operator*(&stack0xffffffffffffffd0->minv,wi);
  local_78.z = vVar2.z;
  local_68.z = local_78.z;
  local_78._0_8_ = vVar2._0_8_;
  local_68.x = local_78.x;
  local_68.y = local_78.y;
  local_78 = vVar2;
  vVar2 = normalize(&local_68);
  _nrmsqr = vVar2._0_8_;
  local_5c._0_4_ = nrmsqr;
  local_5c._4_4_ = dpd;
  local_80 = vVar2.z;
  wi_std.x = local_80;
  _nrmsqr = vVar2;
  nrm = dot((vec3 *)local_40,(vec3 *)local_5c);
  if (nrm <= 0.0) {
    this_local._4_4_ = 0.0;
  }
  else {
    dwdw = dot((vec3 *)local_40,(vec3 *)local_40);
    D = inversesqrt<float>(&dwdw);
    fVar1 = stack0xffffffffffffffd0->detm;
    local_98 = sqr<float>(&dwdw);
    local_98 = fVar1 / local_98;
    vVar2 = djb::operator*((vec3 *)local_40,D);
    uStack_b8 = vVar2._0_8_;
    local_a8 = uStack_b8;
    local_b0 = vVar2.z;
    local_a0 = local_b0;
    (*(this->super_brdf)._vptr_brdf[0xb])(this,&local_a8);
    local_9c = extraout_XMM0_Da;
    (*(this->super_brdf)._vptr_brdf[10])(this,local_5c);
    if (local_9c <= 0.0) {
      local_e4 = 0.0;
    }
    else {
      local_e4 = ((nrm * local_9c) / extraout_XMM0_Da_00) * local_98;
    }
    this_local._4_4_ = local_e4;
  }
  return this_local._4_4_;
}

Assistant:

float_t
microfacet::vndf(const vec3 &wm, const vec3 &wi, const args &args) const
{
	vec3 wm_std = args.mtra * wm;
	vec3 wi_std = normalize(args.minv * wi);
	float_t dpd = dot(wm_std, wi_std);

	if (dpd > 0) {
		float_t nrmsqr = dot(wm_std, wm_std);
		float_t nrm = inversesqrt(nrmsqr);
		float_t dwdw = args.detm / sqr(nrmsqr);
		float_t D = ndf_std(wm_std * nrm);
		float_t sigma = sigma_std(wi_std);

		return D > 0 ? dpd * D / sigma * dwdw : 0;
	}

	return 0;
}